

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectInvariants
          (Interpreter *this,HeapObject *curr,HeapObject *self,uint *counter,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *thunks)

{
  bool bVar1;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *thunks_00;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *this_00;
  HeapObject *in_RCX;
  HeapObject *in_RDX;
  Interpreter *in_RSI;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_RDI;
  uint *in_R8;
  Interpreter *unaff_retaddr;
  HeapThunk *el_th;
  AST *assert;
  iterator __end5;
  iterator __begin5;
  ASTs *__range5;
  HeapSimpleObject *simp;
  HeapExtendedObject *ext;
  _Self local_50;
  _Self local_48;
  _Base_ptr *local_40;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *local_38;
  Interpreter *pIVar2;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *pvVar3;
  
  pvVar3 = in_RDI;
  if (in_RSI == (Interpreter *)0x0) {
    thunks_00 = (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)0x0;
  }
  else {
    thunks_00 = (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)__dynamic_cast(in_RSI,&(anonymous_namespace)::HeapObject::typeinfo,
                                  &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
  }
  if (thunks_00 ==
      (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
       *)0x0) {
    pIVar2 = in_RSI;
    if (in_RSI == (Interpreter *)0x0) {
      this_00 = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 *)0x0;
    }
    else {
      this_00 = (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                 *)__dynamic_cast(in_RSI,&(anonymous_namespace)::HeapObject::typeinfo,
                                  &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
    }
    if (this_00 !=
        (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)0x0) {
      local_40 = &this_00[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_38 = this_00;
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
           begin((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
                 this_00);
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
           end((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00)
      ;
      while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
        std::_List_iterator<jsonnet::internal::AST_*>::operator*
                  ((_List_iterator<jsonnet::internal::AST_*> *)in_RSI);
        (anonymous_namespace)::Interpreter::
        makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,jsonnet::internal::(anonymous_namespace)::HeapObject*&,unsigned_int&,jsonnet::internal::AST*&>
                  (unaff_retaddr,(Identifier **)pvVar3,(HeapObject **)pIVar2,(uint *)in_RDX,
                   (AST **)in_RCX);
        std::
        map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::operator=((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                     *)in_RSI,this_00);
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ::push_back(in_RDI,(value_type *)thunks_00);
        std::_List_iterator<jsonnet::internal::AST_*>::operator++(&local_48);
      }
    }
    *(int *)&(in_RCX->super_HeapEntity)._vptr_HeapEntity =
         *(int *)&(in_RCX->super_HeapEntity)._vptr_HeapEntity + 1;
  }
  else {
    objectInvariants(in_RSI,in_RDX,in_RCX,in_R8,thunks_00);
    objectInvariants(in_RSI,in_RDX,in_RCX,in_R8,thunks_00);
  }
  return;
}

Assistant:

void objectInvariants(HeapObject *curr, HeapObject *self, unsigned &counter,
                          std::vector<HeapThunk *> &thunks)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            objectInvariants(ext->right, self, counter, thunks);
            objectInvariants(ext->left, self, counter, thunks);
        } else {
            if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                for (AST *assert : simp->asserts) {
                    auto *el_th = makeHeap<HeapThunk>(idInvariant, self, counter, assert);
                    el_th->upValues = simp->upValues;
                    thunks.push_back(el_th);
                }
            }
            counter++;
        }
    }